

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pending_query_result.cpp
# Opt level: O2

void __thiscall
duckdb::PendingQueryResult::PendingQueryResult(PendingQueryResult *this,ErrorData *error)

{
  ErrorData local_90;
  
  ErrorData::ErrorData(&local_90,error);
  BaseQueryResult::BaseQueryResult(&this->super_BaseQueryResult,PENDING_RESULT,&local_90);
  ErrorData::~ErrorData(&local_90);
  (this->super_BaseQueryResult)._vptr_BaseQueryResult =
       (_func_int **)&PTR__PendingQueryResult_0279a0d0;
  (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

PendingQueryResult::PendingQueryResult(ErrorData error)
    : BaseQueryResult(QueryResultType::PENDING_RESULT, std::move(error)) {
}